

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall
CodeGenGenericContext::OverwriteRegisterWithValue
          (CodeGenGenericContext *this,x86XmmReg reg,x86Argument arg)

{
  x86Argument *pxVar1;
  
  KillRegister(this,reg);
  InvalidateDependand(this,reg);
  pxVar1 = this->xmmReg + reg;
  pxVar1->ptrBase = arg.ptrBase;
  pxVar1->ptrIndex = arg.ptrIndex;
  *(undefined8 *)(&pxVar1->ptrBase + 2) = arg._24_8_;
  pxVar1 = this->xmmReg + reg;
  pxVar1->type = arg.type;
  *(undefined4 *)&pxVar1->field_0x4 = arg._4_4_;
  pxVar1->field_1 = arg.field_1;
  this->xmmRegUpdate[reg] = (uint)(((long)this->x86Op - (long)this->x86Base) / 0x50);
  this->xmmRegRead[reg] = false;
  return;
}

Assistant:

void CodeGenGenericContext::OverwriteRegisterWithValue(x86XmmReg reg, x86Argument arg)
{
	// Destination is updated
	KillRegister(reg);
	InvalidateDependand(reg);

	xmmReg[reg] = arg;
	xmmRegUpdate[reg] = unsigned(x86Op - x86Base);
	xmmRegRead[reg] = false;
}